

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSearch.cpp
# Opt level: O2

void __thiscall HighsSearch::currentNodeToQueue(HighsSearch *this,HighsNodeQueue *nodequeue)

{
  HighsDomain *this_00;
  pointer piVar1;
  pointer piVar2;
  pointer pNVar3;
  double dVar4;
  double dVar5;
  vector<int,_std::allocator<int>_> branchPositions;
  vector<HighsDomainChange,_std::allocator<HighsDomainChange>_> domchgStack;
  
  dVar4 = ((this->mipsolver->mipdata_)._M_t.
           super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
           super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
           super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->upper_limit;
  dVar5 = this->upper_limit;
  if (dVar4 <= this->upper_limit) {
    dVar5 = dVar4;
  }
  if ((this->nodestack).
      super__Vector_base<HighsSearch::NodeData,_std::allocator<HighsSearch::NodeData>_>._M_impl.
      super__Vector_impl_data._M_finish[-1].lower_bound <= dVar5) {
    this_00 = &this->localdom;
    piVar1 = (this->localdom).changedcols_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    piVar2 = (this->localdom).changedcols_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    HighsDomain::propagate(this_00);
    HighsDomain::clearChangedCols(this_00,(HighsInt)((ulong)((long)piVar1 - (long)piVar2) >> 2));
    if ((this->localdom).infeasible_ != true) {
      branchPositions.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      branchPositions.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      branchPositions.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      HighsDomain::getReducedDomainChangeStack(&domchgStack,this_00,&branchPositions);
      pNVar3 = (this->nodestack).
               super__Vector_base<HighsSearch::NodeData,_std::allocator<HighsSearch::NodeData>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      dVar5 = HighsDomain::getObjectiveLowerBound(this_00);
      dVar4 = pNVar3[-1].lower_bound;
      if (dVar5 <= dVar4) {
        dVar5 = dVar4;
      }
      pNVar3 = (this->nodestack).
               super__Vector_base<HighsSearch::NodeData,_std::allocator<HighsSearch::NodeData>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      dVar4 = HighsNodeQueue::emplaceNode
                        (nodequeue,&domchgStack,&branchPositions,dVar5,pNVar3[-1].estimate,
                         (int)(((long)pNVar3 -
                               (long)(this->nodestack).
                                     super__Vector_base<HighsSearch::NodeData,_std::allocator<HighsSearch::NodeData>_>
                                     ._M_impl.super__Vector_impl_data._M_start) / 0x60) +
                         this->depthoffset);
      if (this->countTreeWeight == true) {
        HighsCDouble::operator+=(&this->treeweight,dVar4);
      }
      std::_Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>::~_Vector_base
                (&domchgStack.
                  super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&branchPositions.super__Vector_base<int,_std::allocator<int>_>);
      goto LAB_002e4b8b;
    }
    HighsDomain::conflictAnalysis
              (this_00,&((this->mipsolver->mipdata_)._M_t.
                         super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                         .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->
                        conflictPool);
  }
  if (this->countTreeWeight == true) {
    dVar4 = ldexp(1.0,((int)(((long)(this->nodestack).
                                    super__Vector_base<HighsSearch::NodeData,_std::allocator<HighsSearch::NodeData>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->nodestack).
                                   super__Vector_base<HighsSearch::NodeData,_std::allocator<HighsSearch::NodeData>_>
                                   ._M_impl.super__Vector_impl_data._M_start) / -0x60) -
                      this->depthoffset) + 1);
    HighsCDouble::operator+=(&this->treeweight,dVar4);
  }
LAB_002e4b8b:
  (this->nodestack).
  super__Vector_base<HighsSearch::NodeData,_std::allocator<HighsSearch::NodeData>_>._M_impl.
  super__Vector_impl_data._M_finish[-1].opensubtrees = '\0';
  return;
}

Assistant:

void HighsSearch::currentNodeToQueue(HighsNodeQueue& nodequeue) {
  auto oldchangedcols = localdom.getChangedCols().size();
  bool prune = nodestack.back().lower_bound > getCutoffBound();
  if (!prune) {
    localdom.propagate();
    localdom.clearChangedCols(oldchangedcols);
    prune = localdom.infeasible();
    if (prune) localdom.conflictAnalysis(mipsolver.mipdata_->conflictPool);
  }
  if (!prune) {
    std::vector<HighsInt> branchPositions;
    auto domchgStack = localdom.getReducedDomainChangeStack(branchPositions);
    double tmpTreeWeight = nodequeue.emplaceNode(
        std::move(domchgStack), std::move(branchPositions),
        std::max(nodestack.back().lower_bound,
                 localdom.getObjectiveLowerBound()),
        nodestack.back().estimate, getCurrentDepth());
    if (countTreeWeight) treeweight += tmpTreeWeight;
  } else {
    mipsolver.mipdata_->debugSolution.nodePruned(localdom);
    if (countTreeWeight) treeweight += std::ldexp(1.0, 1 - getCurrentDepth());
  }
  nodestack.back().opensubtrees = 0;
}